

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

void __thiscall
FIntermissionActionScroller::FIntermissionActionScroller(FIntermissionActionScroller *this)

{
  FIntermissionAction::FIntermissionAction(&this->super_FIntermissionAction);
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionActionScroller_006e6ad8;
  (this->mSecondPic).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FIntermissionAction).mSize = 0x78;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenScroller::RegistrationInfo.MyClass;
  this->mScrollDelay = 0;
  this->mScrollTime = 0x280;
  this->mScrollDir = 1;
  return;
}

Assistant:

FIntermissionActionScroller::FIntermissionActionScroller()
{
	mSize = sizeof(FIntermissionActionScroller);
	mClass = RUNTIME_CLASS(DIntermissionScreenScroller);
	mScrollDelay = 0;
	mScrollTime = 640;
	mScrollDir = SCROLL_Right;
}